

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

uint32_t gravity_list_size(gravity_vm *vm,gravity_list_t *list)

{
  ulong uVar1;
  uint32_t uVar2;
  ulong local_30;
  size_t i;
  size_t count;
  uint32_t internal_size;
  gravity_list_t *list_local;
  gravity_vm *vm_local;
  
  (list->gc).visited = true;
  count._4_4_ = 0;
  uVar1 = (list->array).n;
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    uVar2 = gravity_value_size(vm,(list->array).p[local_30]);
    count._4_4_ = uVar2 + count._4_4_;
  }
  (list->gc).visited = false;
  return count._4_4_ + 0x48;
}

Assistant:

uint32_t gravity_list_size (gravity_vm *vm, gravity_list_t *list) {
    SET_OBJECT_VISITED_FLAG(list, true);
    
    uint32_t internal_size = 0;
    size_t count = marray_size(list->array);
    for (size_t i=0; i<count; ++i) {
        internal_size += gravity_value_size(vm, marray_get(list->array, i));
    }
    internal_size += sizeof(gravity_list_t);
    
    SET_OBJECT_VISITED_FLAG(list, false);
    return internal_size;
}